

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsdf.cpp
# Opt level: O2

Vector3d *
sdf::SDFGradient(Vector3d *__return_storage_ptr__,Vector3d *location,
                vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *primitives)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined8 local_1c8;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  Vector3d *local_198;
  undefined8 *local_190;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_180 [24];
  Vector3d *local_168;
  undefined8 *local_160;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_150 [24];
  Vector3d *local_138;
  undefined8 *local_130;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_120 [24];
  Vector3d *local_108;
  undefined4 *local_100;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_f0 [24];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  Vector3d *local_c0;
  undefined8 *local_b8;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_a8 [24];
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Vector3d *local_78;
  undefined8 *local_70;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_60 [24];
  double *local_48 [2];
  undefined8 local_38;
  
  local_70 = &local_90;
  local_90 = 0x3ee4f8b588e368f1;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = location;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (local_60,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       *)&local_78);
  dVar1 = SDF((Vector3d *)local_60,primitives);
  local_b8 = &local_d8;
  local_d8 = 0x3ee4f8b588e368f1;
  local_d0 = 0;
  uStack_c8 = 0;
  local_c0 = location;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (local_a8,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       *)&local_c0);
  dVar2 = SDF((Vector3d *)local_a8,primitives);
  local_100 = &local_1d8;
  local_1d8 = 0;
  uStack_1d4 = 0;
  uStack_1d0 = 0x88e368f1;
  uStack_1cc = 0x3ee4f8b5;
  local_1c8 = 0;
  local_108 = location;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (local_f0,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       *)&local_108);
  dVar3 = SDF((Vector3d *)local_f0,primitives);
  local_130 = &local_1f8;
  local_1f8 = 0;
  uStack_1f0 = 0x3ee4f8b588e368f1;
  local_1e8 = 0;
  local_138 = location;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (local_120,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_138);
  dVar4 = SDF((Vector3d *)local_120,primitives);
  local_160 = &local_218;
  local_218 = 0;
  uStack_210 = 0;
  local_208 = 0x3ee4f8b588e368f1;
  local_168 = location;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (local_150,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_168);
  dVar5 = SDF((Vector3d *)local_150,primitives);
  local_190 = &local_238;
  local_238 = 0;
  uStack_230 = 0;
  local_228 = 0x3ee4f8b588e368f1;
  local_198 = location;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (local_180,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_198);
  local_1a8 = SDF((Vector3d *)local_180,primitives);
  local_1a8 = dVar5 - local_1a8;
  local_1b8 = dVar1 - dVar2;
  dStack_1b0 = dVar3 - dVar4;
  local_48[0] = &local_1b8;
  local_38 = 0x3ef4f8b588e368f1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d 
  SDFGradient(const Eigen::Vector3d &location,  std::vector<Primitive*> &primitives)
  {
    double delta=1e-05;
    return Eigen::Vector3d(
           SDF(location + Eigen::Vector3d(delta,0,0), primitives) - SDF(location - Eigen::Vector3d(delta,0,0), primitives),
           SDF(location + Eigen::Vector3d(0,delta,0), primitives) - SDF(location - Eigen::Vector3d(0,delta,0), primitives),
           SDF(location + Eigen::Vector3d(0,0,delta), primitives) - SDF(location - Eigen::Vector3d(0,0,delta), primitives))/(2.0*delta);
  }